

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_crypto_two_reg_sha512(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t regno;
  uint32_t regno_00;
  TCGv_ptr arg;
  TCGv_ptr arg_00;
  code *local_50;
  CryptoTwoOpFn *genfn;
  _Bool feature;
  TCGv_ptr tcg_rn_ptr;
  TCGv_ptr tcg_rd_ptr;
  int rd;
  int rn;
  int opcode;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = extract32(insn,10,2);
  regno = extract32(insn,5,5);
  regno_00 = extract32(insn,0,5);
  if (uVar2 == 0) {
    genfn._7_1_ = isar_feature_aa64_sha512(s->isar);
    local_50 = gen_helper_crypto_sha512su0;
  }
  else {
    if (uVar2 != 1) {
      unallocated_encoding_aarch64(s);
      return;
    }
    genfn._7_1_ = isar_feature_aa64_sm4(s->isar);
    local_50 = gen_helper_crypto_sm4e;
  }
  if (genfn._7_1_ == false) {
    unallocated_encoding_aarch64(s);
  }
  else {
    _Var1 = fp_access_check(s);
    if (_Var1) {
      arg = vec_full_reg_ptr(s,regno_00);
      arg_00 = vec_full_reg_ptr(s,regno);
      (*local_50)(tcg_ctx_00,arg,arg_00);
      tcg_temp_free_ptr(tcg_ctx_00,arg);
      tcg_temp_free_ptr(tcg_ctx_00,arg_00);
    }
  }
  return;
}

Assistant:

static void disas_crypto_two_reg_sha512(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int opcode = extract32(insn, 10, 2);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    TCGv_ptr tcg_rd_ptr, tcg_rn_ptr;
    bool feature;
    CryptoTwoOpFn *genfn;

    switch (opcode) {
    case 0: /* SHA512SU0 */
        feature = dc_isar_feature(aa64_sha512, s);
        genfn = gen_helper_crypto_sha512su0;
        break;
    case 1: /* SM4E */
        feature = dc_isar_feature(aa64_sm4, s);
        genfn = gen_helper_crypto_sm4e;
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!feature) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_rd_ptr = vec_full_reg_ptr(s, rd);
    tcg_rn_ptr = vec_full_reg_ptr(s, rn);

    genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr);

    tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
}